

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O3

Solver * __thiscall
despot::PlannerBase::InitializeSolver
          (PlannerBase *this,DSPOMDP *model,Belief *belief,string *solver_type,Option *options)

{
  int iVar1;
  int iVar2;
  ScenarioLowerBound *lb;
  BeliefLowerBound *lower_bound;
  size_t sVar3;
  ScenarioUpperBound *ub;
  POMCPPrior *prior;
  log_ostream *plVar4;
  ostream *poVar5;
  AEMS *this_00;
  BeliefUpperBound *upper_bound;
  undefined8 uVar6;
  char *pcVar7;
  string ptype;
  string ubtype;
  string bubtype;
  string ubtype_1;
  allocator<char> local_199;
  long *local_198;
  long local_190;
  long local_188 [2];
  long *local_178;
  long local_170;
  long local_168 [2];
  DSPOMDP *local_158;
  long *local_150;
  long local_148;
  long local_140 [2];
  long *local_130;
  long local_128;
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  iVar1 = std::__cxx11::string::compare((char *)solver_type);
  if (iVar1 == 0) {
LAB_00161833:
    if (options[0x12].desc == (Descriptor *)0x0) {
      pcVar7 = "DEFAULT";
    }
    else {
      pcVar7 = options[0x12].arg;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,pcVar7,(allocator<char> *)&local_178);
    if (options[0x13].desc == (Descriptor *)0x0) {
      pcVar7 = "DEFAULT";
    }
    else {
      pcVar7 = options[0x13].arg;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,pcVar7,(allocator<char> *)&local_150);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_178,local_170 + (long)local_178);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_198,local_190 + (long)local_198);
    iVar1 = (*model->_vptr_DSPOMDP[0xf])(model,local_50,local_70);
    lb = (ScenarioLowerBound *)CONCAT44(extraout_var,iVar1);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    iVar2 = logging::level();
    iVar1 = 1;
    if (0 < iVar2) {
      iVar2 = logging::level();
      if (2 < iVar2) {
        plVar4 = logging::stream(3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar4->super_ostream,"Created lower bound ",0x14);
        local_158 = (DSPOMDP *)CONCAT44(local_158._4_4_,1);
        if (lb == (ScenarioLowerBound *)0x0) {
          __cxa_bad_typeid();
LAB_001620a6:
          poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: Unsupported solver type: ");
          poVar5 = std::operator<<(poVar5,(string *)solver_type);
          std::endl<char,std::char_traits<char>>(poVar5);
          exit(1);
        }
        pcVar7 = *(char **)(lb->_vptr_ScenarioLowerBound[-1] + 8) +
                 (**(char **)(lb->_vptr_ScenarioLowerBound[-1] + 8) == '*');
        sVar3 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar4->super_ostream,pcVar7,sVar3);
        iVar1 = (int)local_158;
        std::ios::widen((char)(plVar4->super_ostream)._vptr_basic_ostream[-3] + (char)plVar4);
        std::ostream::put((char)plVar4);
        std::ostream::flush();
      }
    }
    iVar2 = std::__cxx11::string::compare((char *)solver_type);
    if (iVar2 == 0) {
      if (options[0x14].desc == (Descriptor *)0x0) {
        pcVar7 = "DEFAULT";
      }
      else {
        pcVar7 = options[0x14].arg;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,pcVar7,(allocator<char> *)&local_130);
      if (options[0x15].desc == (Descriptor *)0x0) {
        pcVar7 = "DEFAULT";
      }
      else {
        pcVar7 = options[0x15].arg;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar7,&local_199);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_130,local_128 + (long)local_130);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,local_150,local_148 + (long)local_150);
      iVar2 = (*model->_vptr_DSPOMDP[0xd])(model,local_90,local_b0);
      ub = (ScenarioUpperBound *)CONCAT44(extraout_var_01,iVar2);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      iVar2 = logging::level();
      if (iVar1 <= iVar2) {
        iVar1 = logging::level();
        if (2 < iVar1) {
          options = (Option *)logging::stream(3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)options,"Created upper bound ",0x14);
          if (ub == (ScenarioUpperBound *)0x0) goto LAB_001620db;
          pcVar7 = *(char **)(ub->_vptr_ScenarioUpperBound[-1] + 8) +
                   (**(char **)(ub->_vptr_ScenarioUpperBound[-1] + 8) == '*');
          sVar3 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)options,pcVar7,sVar3);
          std::ios::widen((char)((ostream *)&options->next_)->_vptr_basic_ostream[-3] +
                          (char)options);
          std::ostream::put((char)options);
          std::ostream::flush();
        }
      }
      this_00 = (AEMS *)operator_new(0xc0);
      DESPOT::DESPOT((DESPOT *)this_00,model,lb,ub,(Belief *)0x0);
      if (local_130 != local_120) {
        operator_delete(local_130,local_120[0] + 1);
      }
      if (local_150 != local_140) {
        operator_delete(local_150,local_140[0] + 1);
      }
    }
    else {
      this_00 = (AEMS *)operator_new(0x50);
      ScenarioBaselineSolver::ScenarioBaselineSolver
                ((ScenarioBaselineSolver *)this_00,lb,(Belief *)0x0);
    }
LAB_0016204a:
    if (local_178 != local_168) {
      operator_delete(local_178,local_168[0] + 1);
    }
LAB_00162065:
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    (*(this_00->super_Solver)._vptr_Solver[4])(this_00,belief);
    return &this_00->super_Solver;
  }
  iVar1 = std::__cxx11::string::compare((char *)solver_type);
  if (iVar1 == 0) goto LAB_00161833;
  iVar1 = std::__cxx11::string::compare((char *)solver_type);
  if (iVar1 == 0) {
LAB_00161846:
    if (options[0x13].desc == (Descriptor *)0x0) {
      pcVar7 = "DEFAULT";
    }
    else {
      pcVar7 = options[0x13].arg;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,pcVar7,(allocator<char> *)&local_178);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_198,local_190 + (long)local_198);
    iVar1 = (*model->_vptr_DSPOMDP[0x1a])(model,local_d0);
    lower_bound = (BeliefLowerBound *)CONCAT44(extraout_var_00,iVar1);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    iVar1 = logging::level();
    if (iVar1 < 1) {
LAB_00161b7c:
      iVar1 = std::__cxx11::string::compare((char *)solver_type);
      if (iVar1 != 0) {
        this_00 = (AEMS *)operator_new(0x50);
        BeliefBaselineSolver::BeliefBaselineSolver
                  ((BeliefBaselineSolver *)this_00,lower_bound,(Belief *)0x0);
        goto LAB_00162065;
      }
      if (options[0x15].desc == (Descriptor *)0x0) {
        pcVar7 = "DEFAULT";
      }
      else {
        pcVar7 = options[0x15].arg;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,pcVar7,(allocator<char> *)&local_150);
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,local_178,local_170 + (long)local_178);
      iVar1 = (*model->_vptr_DSPOMDP[0x1b])(model,local_f0);
      upper_bound = (BeliefUpperBound *)CONCAT44(extraout_var_03,iVar1);
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0],local_e0[0] + 1);
      }
      iVar1 = logging::level();
      if (0 < iVar1) {
        iVar1 = logging::level();
        if (2 < iVar1) {
          options = (Option *)logging::stream(3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)options,"Created upper bound ",0x14);
          if (upper_bound == (BeliefUpperBound *)0x0) goto LAB_001620e5;
          pcVar7 = *(char **)(upper_bound->_vptr_BeliefUpperBound[-1] + 8) +
                   (**(char **)(upper_bound->_vptr_BeliefUpperBound[-1] + 8) == '*');
          sVar3 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)options,pcVar7,sVar3);
          std::ios::widen((char)((ostream *)&options->next_)->_vptr_basic_ostream[-3] +
                          (char)options);
          std::ostream::put((char)options);
          std::ostream::flush();
        }
      }
      this_00 = (AEMS *)operator_new(0xd0);
      AEMS::AEMS(this_00,model,lower_bound,upper_bound,(Belief *)0x0);
      goto LAB_0016204a;
    }
    iVar1 = logging::level();
    if (iVar1 < 3) goto LAB_00161b7c;
    plVar4 = logging::stream(3);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar4->super_ostream,"Created lower bound ",0x14);
    local_158 = model;
    if (lower_bound != (BeliefLowerBound *)0x0) {
      pcVar7 = *(char **)(lower_bound->_vptr_BeliefLowerBound[-1] + 8) +
               (**(char **)(lower_bound->_vptr_BeliefLowerBound[-1] + 8) == '*');
      sVar3 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar4->super_ostream,pcVar7,sVar3);
      model = local_158;
      std::ios::widen((char)(plVar4->super_ostream)._vptr_basic_ostream[-3] + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      goto LAB_00161b7c;
    }
    __cxa_bad_typeid();
LAB_001620db:
    __cxa_bad_typeid();
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)solver_type);
    if (iVar1 == 0) goto LAB_00161846;
    iVar1 = std::__cxx11::string::compare((char *)solver_type);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)solver_type);
      if (iVar1 != 0) goto LAB_001620a6;
    }
    if (options[0x1e].desc == (Descriptor *)0x0) {
      pcVar7 = "DEFAULT";
    }
    else {
      pcVar7 = options[0x1e].arg;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,pcVar7,(allocator<char> *)&local_178);
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_110,local_198,local_190 + (long)local_198);
    iVar1 = (*model->_vptr_DSPOMDP[0x10])(model,local_110);
    prior = (POMCPPrior *)CONCAT44(extraout_var_02,iVar1);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0],local_100[0] + 1);
    }
    iVar1 = logging::level();
    if (iVar1 < 1) {
LAB_00161e9c:
      if (options[0xb].desc != (Descriptor *)0x0) {
        prior->exploration_constant_ = DAT_00192dd0;
      }
      iVar1 = std::__cxx11::string::compare((char *)solver_type);
      if (iVar1 == 0) {
        this_00 = (AEMS *)operator_new(0x60);
        POMCP::POMCP((POMCP *)this_00,model,prior,(Belief *)0x0);
      }
      else {
        this_00 = (AEMS *)operator_new(0x60);
        DPOMCP::DPOMCP((DPOMCP *)this_00,model,prior,(Belief *)0x0);
      }
      goto LAB_00162065;
    }
    iVar1 = logging::level();
    if (iVar1 < 3) goto LAB_00161e9c;
    plVar4 = logging::stream(3);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar4->super_ostream,"Created POMCP prior ",0x14);
    if (prior != (POMCPPrior *)0x0) {
      poVar5 = std::operator<<(&plVar4->super_ostream,
                               *(char **)(prior->_vptr_POMCPPrior[-1] + 8) +
                               (**(char **)(prior->_vptr_POMCPPrior[-1] + 8) == '*'));
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_00161e9c;
    }
  }
  __cxa_bad_typeid();
LAB_001620e5:
  uVar6 = __cxa_bad_typeid();
  operator_delete(options,0x60);
  if (local_198 != local_188) {
    operator_delete(local_198,local_188[0] + 1);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

Solver *PlannerBase::InitializeSolver(DSPOMDP *model, Belief* belief,
		string solver_type, option::Option *options) {
	Solver *solver = NULL;
	// DESPOT or its default policy
	if (solver_type == "DESPOT" || solver_type == "PLB") // PLB: particle lower bound
			{
		string blbtype =
				options[E_BLBTYPE] ? options[E_BLBTYPE].arg : "DEFAULT";
		string lbtype = options[E_LBTYPE] ? options[E_LBTYPE].arg : "DEFAULT";
		ScenarioLowerBound *lower_bound = model->CreateScenarioLowerBound(
				lbtype, blbtype);

		logi << "Created lower bound " << typeid(*lower_bound).name() << endl;

		if (solver_type == "DESPOT") {
			string bubtype =
					options[E_BUBTYPE] ? options[E_BUBTYPE].arg : "DEFAULT";
			string ubtype =
					options[E_UBTYPE] ? options[E_UBTYPE].arg : "DEFAULT";
			ScenarioUpperBound *upper_bound = model->CreateScenarioUpperBound(
					ubtype, bubtype);

			logi << "Created upper bound " << typeid(*upper_bound).name()
					<< endl;

			solver = new DESPOT(model, lower_bound, upper_bound);
		} else
			solver = new ScenarioBaselineSolver(lower_bound);
	} // AEMS or its default policy
	else if (solver_type == "AEMS" || solver_type == "BLB") {
		string lbtype = options[E_LBTYPE] ? options[E_LBTYPE].arg : "DEFAULT";
		BeliefLowerBound *lower_bound =
				static_cast<BeliefMDP *>(model)->CreateBeliefLowerBound(lbtype);

		logi << "Created lower bound " << typeid(*lower_bound).name() << endl;

		if (solver_type == "AEMS") {
			string ubtype =
					options[E_UBTYPE] ? options[E_UBTYPE].arg : "DEFAULT";
			BeliefUpperBound *upper_bound =
					static_cast<BeliefMDP *>(model)->CreateBeliefUpperBound(
							ubtype);

			logi << "Created upper bound " << typeid(*upper_bound).name()
					<< endl;

			solver = new AEMS(model, lower_bound, upper_bound);
		} else
			solver = new BeliefBaselineSolver(lower_bound);
	} // POMCP or DPOMCP
	else if (solver_type == "POMCP" || solver_type == "DPOMCP") {
		string ptype = options[E_PRIOR] ? options[E_PRIOR].arg : "DEFAULT";
		POMCPPrior *prior = model->CreatePOMCPPrior(ptype);

		logi << "Created POMCP prior " << typeid(*prior).name() << endl;

		if (options[E_PRUNE]) {
			prior->exploration_constant(Globals::config.pruning_constant);
		}

		if (solver_type == "POMCP")
			solver = new POMCP(model, prior);
		else
			solver = new DPOMCP(model, prior);
	} else { // Unsupported solver
		cerr << "ERROR: Unsupported solver type: " << solver_type << endl;
		exit(1);
	}

	assert(solver != NULL);
	solver->belief(belief);

	return solver;
}